

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::parsePageContents(QPDFObjectHandle *this,ParserCallbacks *callbacks)

{
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80 [2];
  QPDFObjGen local_60;
  string local_58;
  undefined1 local_38 [8];
  string description;
  ParserCallbacks *callbacks_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = callbacks;
  local_60 = getObjGen(this);
  QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_60,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "page object ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Contents",&local_a1);
  getKey(local_80,(string *)this);
  parseContentStream_internal
            (local_80,(string *)local_38,(ParserCallbacks *)description.field_2._8_8_);
  ~QPDFObjectHandle(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
QPDFObjectHandle::parsePageContents(ParserCallbacks* callbacks)
{
    std::string description = "page object " + getObjGen().unparse(' ');
    this->getKey("/Contents").parseContentStream_internal(description, callbacks);
}